

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transwarp.h
# Opt level: O0

void transwarp::detail::
     call_with_each_index<2ul,3ul,4ul,5ul,6ul,7ul,transwarp::detail::unvisit_visitor,std::tuple<std::__cxx11::string,int,int>,std::vector<BamTools::RefData,std::allocator<BamTools::RefData>>,std::map<std::__cxx11::string,int,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>,int,bool,std::map<std::__cxx11::string,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>>>>,std::__cxx11::string,std::__cxx11::string>
               (unvisit_visitor *param_1,_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *param_2)

{
  bool bVar1;
  __tuple_element_t<2UL,_tuple<shared_ptr<task<tuple<basic_string<char>,_int,_int>_>_>,_shared_ptr<task<vector<RefData,_allocator<RefData>_>_>_>,_shared_ptr<task<map<basic_string<char>,_int,_less<basic_string<char>_>,_allocator<pair<const_basic_string<char>,_int>_>_>_>_>,_shared_ptr<task<int>_>,_shared_ptr<task<bool>_>,_shared_ptr<task<map<basic_string<char>,_vector<pair<long,_long>,_allocator<pair<long,_long>_>_>,_less<basic_string<char>_>,_allocator<pair<const_basic_string<char>,_vector<pair<long,_long>,_allocator<pair<long,_long>_>_>_>_>_>_>_>,_shared_ptr<task<basic_string<char>_>_>,_shared_ptr<task<basic_string<char>_>_>_>_>
  *p_Var2;
  invalid_parameter *this;
  itask *task;
  allocator local_51;
  string local_50;
  undefined1 local_30 [8];
  __tuple_element_t<2UL,_tuple<shared_ptr<task<tuple<basic_string<char>,_int,_int>_>_>,_shared_ptr<task<vector<RefData,_allocator<RefData>_>_>_>,_shared_ptr<task<map<basic_string<char>,_int,_less<basic_string<char>_>,_allocator<pair<const_basic_string<char>,_int>_>_>_>_>,_shared_ptr<task<int>_>,_shared_ptr<task<bool>_>,_shared_ptr<task<map<basic_string<char>,_vector<pair<long,_long>,_allocator<pair<long,_long>_>_>,_less<basic_string<char>_>,_allocator<pair<const_basic_string<char>,_vector<pair<long,_long>,_allocator<pair<long,_long>_>_>_>_>_>_>_>,_shared_ptr<task<basic_string<char>_>_>,_shared_ptr<task<basic_string<char>_>_>_>_>
  ptr;
  tuple<std::shared_ptr<transwarp::task<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>_>,_std::shared_ptr<transwarp::task<std::vector<BamTools::RefData,_std::allocator<BamTools::RefData>_>_>_>,_std::shared_ptr<transwarp::task<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>_>,_std::shared_ptr<transwarp::task<int>_>,_std::shared_ptr<transwarp::task<bool>_>,_std::shared_ptr<transwarp::task<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>_>_>_>_>_>,_std::shared_ptr<transwarp::task<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::shared_ptr<transwarp::task<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *t_local;
  unvisit_visitor *f_local;
  
  ptr.
  super___shared_ptr<transwarp::task<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = param_2;
  p_Var2 = std::
           get<2ul,std::shared_ptr<transwarp::task<std::tuple<std::__cxx11::string,int,int>>>,std::shared_ptr<transwarp::task<std::vector<BamTools::RefData,std::allocator<BamTools::RefData>>>>,std::shared_ptr<transwarp::task<std::map<std::__cxx11::string,int,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>>>,std::shared_ptr<transwarp::task<int>>,std::shared_ptr<transwarp::task<bool>>,std::shared_ptr<transwarp::task<std::map<std::__cxx11::string,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>>>>>>,std::shared_ptr<transwarp::task<std::__cxx11::string>>,std::shared_ptr<transwarp::task<std::__cxx11::string>>>
                     ((tuple<std::shared_ptr<transwarp::task<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>_>,_std::shared_ptr<transwarp::task<std::vector<BamTools::RefData,_std::allocator<BamTools::RefData>_>_>_>,_std::shared_ptr<transwarp::task<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>_>,_std::shared_ptr<transwarp::task<int>_>,_std::shared_ptr<transwarp::task<bool>_>,_std::shared_ptr<transwarp::task<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>_>_>_>_>_>,_std::shared_ptr<transwarp::task<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::shared_ptr<transwarp::task<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)param_2);
  std::
  shared_ptr<transwarp::task<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>_>
  ::shared_ptr((shared_ptr<transwarp::task<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>_>
                *)local_30,p_Var2);
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_30);
  if (!bVar1) {
    this = (invalid_parameter *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_50,"task pointer",&local_51);
    invalid_parameter::invalid_parameter(this,&local_50);
    __cxa_throw(this,&invalid_parameter::typeinfo,invalid_parameter::~invalid_parameter);
  }
  task = &std::
          __shared_ptr_access<transwarp::task<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
          ::operator*((__shared_ptr_access<transwarp::task<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_30)->super_itask;
  unvisit_visitor::operator()(param_1,task);
  call_with_each_index<3ul,4ul,5ul,6ul,7ul,transwarp::detail::unvisit_visitor,std::tuple<std::__cxx11::string,int,int>,std::vector<BamTools::RefData,std::allocator<BamTools::RefData>>,std::map<std::__cxx11::string,int,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>,int,bool,std::map<std::__cxx11::string,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>>>>,std::__cxx11::string,std::__cxx11::string>
            (param_1,ptr.
                     super___shared_ptr<transwarp::task<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi);
  std::
  shared_ptr<transwarp::task<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>_>
  ::~shared_ptr((shared_ptr<transwarp::task<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>_>
                 *)local_30);
  return;
}

Assistant:

void call_with_each_index(transwarp::detail::indices<i, j...>, const Functor& f, const std::tuple<std::shared_ptr<transwarp::task<ParentResults>>...>& t) {
    auto ptr = std::get<i>(t);
    if (!ptr) {
        throw transwarp::invalid_parameter("task pointer");
    }
    f(*ptr);
    transwarp::detail::call_with_each_index(transwarp::detail::indices<j...>(), f, t);
}